

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenInitializer::SetupCustomTargets(cmQtAutoGenInitializer *this)

{
  bool bVar1;
  string emsg;
  string local_50;
  string local_30;
  
  bVar1 = cmsys::SystemTools::MakeDirectory(&(this->Dir).Info,(mode_t *)0x0);
  if (bVar1) {
    if (((this->Moc).super_GenVarsT.Enabled != false) ||
       (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
      bVar1 = SetupWriteAutogenInfo(this);
      if (!bVar1) goto LAB_002d1ab7;
    }
    bVar1 = true;
    if ((this->Rcc).super_GenVarsT.Enabled == true) {
      bVar1 = SetupWriteRccInfo(this);
      return bVar1;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"AutoGen: Could not create directory: ",
               (allocator<char> *)&local_50);
    cmQtAutoGen::Quoted(&local_50,&(this->Dir).Info);
    std::__cxx11::string::append((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    cmSystemTools::Error(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
LAB_002d1ab7:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmQtAutoGenInitializer::SetupCustomTargets()
{
  // Create info directory on demand
  if (!cmSystemTools::MakeDirectory(this->Dir.Info)) {
    std::string emsg = ("AutoGen: Could not create directory: ");
    emsg += Quoted(this->Dir.Info);
    cmSystemTools::Error(emsg);
    return false;
  }

  // Generate autogen target info file
  if (this->MocOrUicEnabled()) {
    // Write autogen target info files
    if (!this->SetupWriteAutogenInfo()) {
      return false;
    }
  }

  // Write AUTORCC info files
  return !this->Rcc.Enabled || this->SetupWriteRccInfo();
}